

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

bool __thiscall ON_Annotation::AllowTextScaling(ON_Annotation *this)

{
  return this->m_allow_text_scaling;
}

Assistant:

bool ON_Annotation::AllowTextScaling() const
{
  // These functions are being added to continue the V5 behavior of
  // per-object text scaling. There is no user interface
  // in V6 or V7 that shows this setting or that allows a user
  // to change this setting.
  // AllowTextScaling() = false means the effective dimstyle value 
  // of DimScale() (model space scale factor) is ignored (treated as if it were 1).
  return m_allow_text_scaling;
}